

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifinpevt(bifcxdef *ctx,int argc)

{
  long lVar1;
  int iVar2;
  undefined1 *puVar3;
  anon_union_8_4_1dda36f5_for_runsv aVar4;
  int in_ESI;
  long in_RDI;
  char keyname [20];
  size_t paramlen;
  runsdef val;
  ushort lstsiz;
  uchar *p;
  int evt;
  os_event_info_t info;
  int use_timeout;
  unsigned_long timeout;
  int in_stack_fffffffffffffe8c;
  runcxdef *in_stack_fffffffffffffe90;
  os_event_info_t *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea4;
  unsigned_long in_stack_fffffffffffffea8;
  size_t local_148;
  runsdef local_140;
  ushort local_12a;
  anon_union_8_4_1dda36f5_for_runsv local_128;
  undefined4 in_stack_fffffffffffffee4;
  runsdef *in_stack_fffffffffffffee8;
  runsdef *in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  runcxdef *in_stack_ffffffffffffff00;
  
  if ((in_ESI != 0) && (0 < in_ESI)) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    }
    in_stack_fffffffffffffe90 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  }
  if (1 < in_ESI) {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  }
  outflushn(0);
  outreset();
  iVar2 = os_get_event(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,in_stack_fffffffffffffe98
                      );
  local_12a = 7;
  if (iVar2 == 1) {
    get_ext_key_name(in_stack_fffffffffffffe98->href,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20)
                     ,(int)in_stack_fffffffffffffe90);
    local_148 = strlen(&stack0xfffffffffffffe98);
    local_12a = local_12a + (short)local_148 + 3;
  }
  else if (iVar2 == 3) {
    local_148 = strlen(&stack0xfffffffffffffee4);
    local_12a = local_12a + (short)local_148 + 3;
  }
  if ((uint)((int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) -
            (int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x38)) <= (uint)local_12a) {
    runhcmp(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
            in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
            (runsdef *)CONCAT44(in_stack_fffffffffffffee4,iVar2));
  }
  local_140.runstyp = '\a';
  local_140.runsv =
       (anon_union_8_4_1dda36f5_for_runsv)
       ((anon_union_8_4_1dda36f5_for_runsv *)(*(long *)(in_RDI + 8) + 0x38))->runsvstr;
  local_128 = local_140.runsv;
  oswp2(local_140.runsv.runsvstr,(uint)local_12a);
  puVar3 = (undefined1 *)(local_128.runsvnum + 2);
  local_128.runsvstr = (uchar *)(local_128.runsvnum + 3);
  *puVar3 = 1;
  oswp4s(local_128.runsvstr,(long)iVar2);
  aVar4.runsvnum = local_128.runsvnum + 4;
  if (iVar2 == 1) {
    local_128.runsvnum = local_128.runsvnum + 5;
    *aVar4.runsvstr = 3;
    oswp2(local_128.runsvstr,(int)local_148 + 2);
    local_128.runsvnum = local_128.runsvnum + 2;
    memcpy(local_128.runsvstr,&stack0xfffffffffffffe98,local_148);
    aVar4 = (anon_union_8_4_1dda36f5_for_runsv)(local_148 + (long)local_128);
  }
  else if (iVar2 == 3) {
    local_128.runsvnum = local_128.runsvnum + 5;
    *aVar4.runsvstr = 3;
    oswp2(local_128.runsvstr,(int)local_148 + 2);
    memcpy((undefined1 *)((long)local_128 + 2),&stack0xfffffffffffffee4,local_148);
    aVar4 = local_128;
  }
  local_128 = aVar4;
  *(long *)(*(long *)(in_RDI + 8) + 0x38) =
       *(long *)(*(long *)(in_RDI + 8) + 0x38) + (long)(int)(uint)local_12a;
  runrepush(*(runcxdef **)(in_RDI + 8),&local_140);
  return;
}

Assistant:

void bifinpevt(bifcxdef *ctx, int argc)
{
    unsigned long timeout;
    int use_timeout;
    os_event_info_t info;
    int evt;
    uchar *p;
    ushort lstsiz;
    runsdef val;
    size_t paramlen;
    char keyname[20];
    
    /* check for a timeout value */
    if (argc == 0)
    {
        /* there's no timeout */
        use_timeout = FALSE;
        timeout = 0;
    }
    else if (argc >= 1)
    {
        /* get the timeout value */
        use_timeout = TRUE;
        timeout = (unsigned long)runpopnum(ctx->bifcxrun);
    }

    /* ensure we don't have too many arguments */
    if (argc > 1)
        runsig(ctx->bifcxrun, ERR_BIFARGC);

    /* flush any pending output */
    tioflushn(ctx->bifcxtio, 0);

    /* reset count of lines since keyboard input */
    tioreset(ctx->bifcxtio);

    /* ask the OS code for an event */
    evt = os_get_event(timeout, use_timeout, &info);

    /* 
     *   the list always minimally needs two bytes of length prefix plus a
     *   number with the event code (one byte for the type, four bytes for
     *   the value) 
     */
    lstsiz = 2 + (1 + 4);

    /* figure out how much space we'll need based on the event type */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* 
         *   we need space for a string with one or two bytes (depending
         *   on whether or not we have an extended key code) - 1 byte for
         *   type code, 2 for length prefix, and 1 or 2 for the string's
         *   contents 
         */
        paramlen = (info.key[0] == 0 ? 2 : 1);

        /* map the extended key */
        get_ext_key_name(keyname, info.key[0], info.key[1]);

        /* determine the length we need for the string */
        paramlen = strlen(keyname);

        /* add it into the list */
        lstsiz += 1 + 2 + paramlen;
        break;

    case OS_EVT_HREF:
        /* 
         *   we need space for the href string - 1 byte for type code, 2
         *   for length prefix, plus the string's contents 
         */
        paramlen = strlen(info.href);
        lstsiz += 1 + 2 + (ushort)paramlen;
        break;

    default:
        /* other event types have no extra data */
        break;
    }

    /* allocate space for the list */
    runhres(ctx->bifcxrun, lstsiz, 0);

    /* set up the stack value */
    val.runstyp = DAT_LIST;
    p = val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

    /* set up the list length prefix */
    oswp2(p, lstsiz);
    p += 2;

    /* set up the event type element */
    *p++ = DAT_NUMBER;
    oswp4s(p, evt);
    p += 4;

    /* add the event parameters, if any */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* set up the string for the key */
        *p++ = DAT_SSTRING;
        oswp2(p, paramlen + 2);
        p += 2;

        /* add the characters to the string */
        memcpy(p, keyname, paramlen);
        p += paramlen;
        break;

    case OS_EVT_HREF:
        /* add the string for the href */
        *p++ = DAT_SSTRING;
        oswp2(p, paramlen + 2);
        memcpy(p + 2, info.href, paramlen);
        break;
    }

    /* consume the heap space */
    ctx->bifcxrun->runcxhp += lstsiz;

    /* push the result */
    runrepush(ctx->bifcxrun, &val);
}